

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

sample_type __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::encoder_strategy>::
encode_run_interruption_pixel
          (jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::encoder_strategy> *this,
          int32_t x,int32_t ra,int32_t rb)

{
  uint uVar1;
  int32_t iVar2;
  int iVar3;
  reference pvVar4;
  uchar *tbs;
  undefined4 in_register_00000014;
  size_t *siglen;
  undefined4 in_register_00000034;
  size_t in_R8;
  int32_t error_value;
  int32_t error_value_1;
  int32_t rb_local;
  int32_t ra_local;
  int32_t x_local;
  jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::encoder_strategy> *this_local;
  
  uVar1 = ra - rb;
  tbs = (uchar *)(ulong)-uVar1;
  if ((int)uVar1 < 1) {
    uVar1 = -uVar1;
  }
  if ((int)uVar1 < 1) {
    iVar2 = lossless_traits<unsigned_char,_8>::compute_error_value(x - ra);
    pvVar4 = std::array<charls::context_run_mode,_2UL>::operator[](&this->context_run_mode_,1);
    encode_run_interruption_error(this,pvVar4,iVar2);
    this_local._7_1_ = lossless_traits<unsigned_char,_8>::compute_reconstructed_sample(ra,iVar2);
  }
  else {
    iVar3 = charls::sign((EVP_PKEY_CTX *)(ulong)(uint)(rb - ra),
                         (uchar *)CONCAT44(in_register_00000034,x),
                         (size_t *)CONCAT44(in_register_00000014,ra),tbs,in_R8);
    iVar2 = lossless_traits<unsigned_char,_8>::compute_error_value((x - rb) * iVar3);
    pvVar4 = std::array<charls::context_run_mode,_2UL>::operator[](&this->context_run_mode_,0);
    encode_run_interruption_error(this,pvVar4,iVar2);
    iVar3 = charls::sign((EVP_PKEY_CTX *)(ulong)(uint)(rb - ra),(uchar *)pvVar4,siglen,tbs,in_R8);
    this_local._7_1_ =
         lossless_traits<unsigned_char,_8>::compute_reconstructed_sample(rb,iVar2 * iVar3);
  }
  return this_local._7_1_;
}

Assistant:

sample_type encode_run_interruption_pixel(const int32_t x, const int32_t ra, const int32_t rb)
    {
        if (std::abs(ra - rb) <= traits_.near_lossless)
        {
            const int32_t error_value{traits_.compute_error_value(x - ra)};
            encode_run_interruption_error(context_run_mode_[1], error_value);
            return static_cast<sample_type>(traits_.compute_reconstructed_sample(ra, error_value));
        }

        const int32_t error_value{traits_.compute_error_value((x - rb) * sign(rb - ra))};
        encode_run_interruption_error(context_run_mode_[0], error_value);
        return static_cast<sample_type>(traits_.compute_reconstructed_sample(rb, error_value * sign(rb - ra)));
    }